

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField
          (ExtensionSet *this,int number,FieldType field_type,bool packed,FieldDescriptor *desc)

{
  byte bVar1;
  Extension *pEVar2;
  void *pvVar3;
  RepeatedField<double> *this_00;
  Arena *pAVar4;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar5;
  Arena *local_38 [2];
  
  pVar5 = Insert(this,number);
  pEVar2 = pVar5.first;
  pEVar2->descriptor = desc;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
  goto switchD_001f0236_default;
  pEVar2->is_repeated = true;
  bVar1 = pEVar2->field_0xa;
  pEVar2->field_0xa = bVar1 | 1;
  pEVar2->type = field_type;
  pEVar2->is_packed = packed;
  if ((bVar1 & 2) == 0) {
    switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)field_type * 4)) {
    case 1:
      pAVar4 = this->arena_;
      if (pAVar4 == (Arena *)0x0) {
        this_00 = (RepeatedField<double> *)operator_new(0x10);
        RepeatedField<int>::RepeatedField((RepeatedField<int> *)this_00,(Arena *)0x0);
      }
      else {
LAB_001f0317:
        pvVar3 = Arena::Allocate(pAVar4,0x10);
        local_38[0] = pAVar4;
        this_00 = (RepeatedField<double> *)
                  Arena::InternalHelper<google::protobuf::RepeatedField<int>>::
                  Construct<google::protobuf::Arena*>(pvVar3,local_38);
      }
      break;
    case 2:
      pAVar4 = this->arena_;
      if (pAVar4 == (Arena *)0x0) {
        this_00 = (RepeatedField<double> *)operator_new(0x10);
        RepeatedField<long>::RepeatedField((RepeatedField<long> *)this_00,(Arena *)0x0);
      }
      else {
        pvVar3 = Arena::Allocate(pAVar4,0x10);
        local_38[0] = pAVar4;
        this_00 = (RepeatedField<double> *)
                  Arena::InternalHelper<google::protobuf::RepeatedField<long>>::
                  Construct<google::protobuf::Arena*>(pvVar3,local_38);
      }
      break;
    case 3:
      pAVar4 = this->arena_;
      if (pAVar4 == (Arena *)0x0) {
        this_00 = (RepeatedField<double> *)operator_new(0x10);
        RepeatedField<unsigned_int>::RepeatedField
                  ((RepeatedField<unsigned_int> *)this_00,(Arena *)0x0);
      }
      else {
        pvVar3 = Arena::Allocate(pAVar4,0x10);
        local_38[0] = pAVar4;
        this_00 = (RepeatedField<double> *)
                  Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_int>>::
                  Construct<google::protobuf::Arena*>(pvVar3,local_38);
      }
      break;
    case 4:
      pAVar4 = this->arena_;
      if (pAVar4 == (Arena *)0x0) {
        this_00 = (RepeatedField<double> *)operator_new(0x10);
        RepeatedField<unsigned_long>::RepeatedField
                  ((RepeatedField<unsigned_long> *)this_00,(Arena *)0x0);
      }
      else {
        pvVar3 = Arena::Allocate(pAVar4,0x10);
        local_38[0] = pAVar4;
        this_00 = (RepeatedField<double> *)
                  Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
                  Construct<google::protobuf::Arena*>(pvVar3,local_38);
      }
      break;
    case 5:
      pAVar4 = this->arena_;
      if (pAVar4 == (Arena *)0x0) {
        this_00 = (RepeatedField<double> *)operator_new(0x10);
        RepeatedField<double>::RepeatedField(this_00,(Arena *)0x0);
      }
      else {
        pvVar3 = Arena::Allocate(pAVar4,0x10);
        local_38[0] = pAVar4;
        this_00 = Arena::InternalHelper<google::protobuf::RepeatedField<double>>::
                  Construct<google::protobuf::Arena*>(pvVar3,local_38);
      }
      break;
    case 6:
      pAVar4 = this->arena_;
      if (pAVar4 == (Arena *)0x0) {
        this_00 = (RepeatedField<double> *)operator_new(0x10);
        RepeatedField<float>::RepeatedField((RepeatedField<float> *)this_00,(Arena *)0x0);
      }
      else {
        pvVar3 = Arena::Allocate(pAVar4,0x10);
        local_38[0] = pAVar4;
        this_00 = (RepeatedField<double> *)
                  Arena::InternalHelper<google::protobuf::RepeatedField<float>>::
                  Construct<google::protobuf::Arena*>(pvVar3,local_38);
      }
      break;
    case 7:
      pAVar4 = this->arena_;
      if (pAVar4 == (Arena *)0x0) {
        this_00 = (RepeatedField<double> *)operator_new(0x10);
        RepeatedField<bool>::RepeatedField((RepeatedField<bool> *)this_00,(Arena *)0x0);
      }
      else {
        pvVar3 = Arena::Allocate(pAVar4,0x10);
        local_38[0] = pAVar4;
        this_00 = (RepeatedField<double> *)
                  Arena::InternalHelper<google::protobuf::RepeatedField<bool>>::
                  Construct<google::protobuf::Arena*>(pvVar3,local_38);
      }
      break;
    case 8:
      pAVar4 = this->arena_;
      if (pAVar4 != (Arena *)0x0) goto LAB_001f0317;
      this_00 = (RepeatedField<double> *)operator_new(0x10);
      RepeatedField<int>::RepeatedField((RepeatedField<int> *)this_00,(Arena *)0x0);
      break;
    case 9:
    case 10:
      pAVar4 = this->arena_;
      if (pAVar4 == (Arena *)0x0) goto LAB_001f03cb;
      this_00 = (RepeatedField<double> *)Arena::Allocate(pAVar4,0x18);
      (this_00->soo_rep_).field_0.long_rep.elements_int = 0;
      (this_00->soo_rep_).field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0
      ;
      this_00[1].soo_rep_.field_0.long_rep.elements_int = (uintptr_t)pAVar4;
      break;
    default:
      goto switchD_001f0236_default;
    }
  }
  else {
    MutableRawRepeatedField((ExtensionSet *)local_38);
LAB_001f03cb:
    this_00 = (RepeatedField<double> *)operator_new(0x18);
    (this_00->soo_rep_).field_0.long_rep.elements_int = 0;
    (this_00->soo_rep_).field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
    this_00[1].soo_rep_.field_0.long_rep.elements_int = 0;
  }
  (pEVar2->field_0).int64_t_value = (int64_t)this_00;
switchD_001f0236_default:
  return (void *)(pEVar2->field_0).int64_t_value;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number, FieldType field_type,
                                            bool packed,
                                            const FieldDescriptor* desc) {
  Extension* extension;

  // We instantiate an empty Repeated{,Ptr}Field if one doesn't exist for this
  // extension.
  if (MaybeNewExtension(number, desc, &extension)) {
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->type = field_type;
    extension->is_packed = packed;
    ABSL_DCHECK(!extension->is_cleared);

    switch (WireFormatLite::FieldTypeToCppType(
        static_cast<WireFormatLite::FieldType>(field_type))) {
      case WireFormatLite::CPPTYPE_INT32:
        extension->ptr.repeated_int32_t_value =
            Arena::Create<RepeatedField<int32_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_INT64:
        extension->ptr.repeated_int64_t_value =
            Arena::Create<RepeatedField<int64_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT32:
        extension->ptr.repeated_uint32_t_value =
            Arena::Create<RepeatedField<uint32_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT64:
        extension->ptr.repeated_uint64_t_value =
            Arena::Create<RepeatedField<uint64_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_DOUBLE:
        extension->ptr.repeated_double_value =
            Arena::Create<RepeatedField<double>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_FLOAT:
        extension->ptr.repeated_float_value =
            Arena::Create<RepeatedField<float>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_BOOL:
        extension->ptr.repeated_bool_value =
            Arena::Create<RepeatedField<bool>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_ENUM:
        extension->ptr.repeated_enum_value =
            Arena::Create<RepeatedField<int>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_STRING:
        extension->ptr.repeated_string_value =
            Arena::Create<RepeatedPtrField<std::string>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        extension->ptr.repeated_message_value =
            Arena::Create<RepeatedPtrField<MessageLite>>(arena_);
        break;
    }
  }

  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->ptr.repeated_int32_t_value;
}